

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int GEO::compare_line(line *first,line *second)

{
  if (first->start == second->start) {
    if (first->end == second->end) {
      return 1;
    }
  }
  else if (first->start == second->end) {
    return 2;
  }
  return 3;
}

Assistant:

int GEO::compare_line(const line &first, const line &second)
{
    if (first.start==second.start)
    {
        if (first.end==second.end)
        {
            return 1;
        }
    }
    else if (first.start==second.end)
        return 2;
    return 3;
}